

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prefix.cpp
# Opt level: O1

GateStatus duckdb::Prefix::Split(ART *art,reference<Node> *node,Node *child,uint8_t pos)

{
  byte bVar1;
  byte bVar2;
  Node other;
  Node *node_00;
  idx_t iVar3;
  uint uVar4;
  undefined7 in_register_00000009;
  Prefix prefix;
  Prefix new_prefix;
  Prefix local_58;
  Prefix local_40;
  
  Prefix(&local_58,art,(Node)(node->_M_data->super_IndexPointer).data,true,false);
  uVar4 = (int)CONCAT71(in_register_00000009,pos) + 1;
  bVar1 = art->prefix_count;
  bVar2 = local_58.data[bVar1];
  if (uVar4 == bVar1) {
    local_58.data[bVar1] = bVar2 - 1;
    node->_M_data = local_58.ptr;
    (child->super_IndexPointer).data = ((local_58.ptr)->super_IndexPointer).data;
  }
  else {
    if (uVar4 < bVar2) {
      NewInternal(&local_40,art,child,(data_ptr_t)0x0,'\0',0,PREFIX);
      local_40.data[art->prefix_count] = ~pos + local_58.data[art->prefix_count];
      switchD_00b1422a::default
                (local_40.data,local_58.data + (ulong)pos + 1,
                 (ulong)local_40.data[art->prefix_count]);
      other.super_IndexPointer.data = (IndexPointer)((local_58.ptr)->super_IndexPointer).data;
      if (other.super_IndexPointer.data._7_1_ == '\x01') {
        Append(&local_40,art,other);
      }
      else {
        ((local_40.ptr)->super_IndexPointer).data = (idx_t)other.super_IndexPointer.data;
      }
    }
    else if (uVar4 == bVar2) {
      (child->super_IndexPointer).data = ((local_58.ptr)->super_IndexPointer).data;
    }
    local_58.data[art->prefix_count] = pos;
    if (pos == '\0') {
      node_00 = node->_M_data;
      iVar3 = (node_00->super_IndexPointer).data;
      ((local_58.ptr)->super_IndexPointer).data = 0;
      Node::Free(art,node_00);
      return (GateStatus)(iVar3 >> 0x3f);
    }
    node->_M_data = local_58.ptr;
  }
  return GATE_NOT_SET;
}

Assistant:

GateStatus Prefix::Split(ART &art, reference<Node> &node, Node &child, const uint8_t pos) {
	D_ASSERT(node.get().HasMetadata());

	Prefix prefix(art, node, true);

	// The split is at the last prefix byte. Decrease the count and return.
	if (pos + 1 == Count(art)) {
		prefix.data[Count(art)]--;
		node = *prefix.ptr;
		child = *prefix.ptr;
		return GateStatus::GATE_NOT_SET;
	}

	if (pos + 1 < prefix.data[Count(art)]) {
		// Create a new prefix and
		// 1. copy the remaining bytes of this prefix.
		// 2. append remaining prefix nodes.
		auto new_prefix = NewInternal(art, child, nullptr, 0, 0, PREFIX);
		new_prefix.data[Count(art)] = prefix.data[Count(art)] - pos - 1;
		memcpy(new_prefix.data, prefix.data + pos + 1, new_prefix.data[Count(art)]);

		if (prefix.ptr->GetType() == PREFIX && prefix.ptr->GetGateStatus() == GateStatus::GATE_NOT_SET) {
			new_prefix.Append(art, *prefix.ptr);
		} else {
			*new_prefix.ptr = *prefix.ptr;
		}

	} else if (pos + 1 == prefix.data[Count(art)]) {
		// No prefix bytes after the split.
		child = *prefix.ptr;
	}

	// Set the new count of this node.
	prefix.data[Count(art)] = pos;

	// No bytes left before the split, free this node.
	if (pos == 0) {
		auto old_status = node.get().GetGateStatus();
		prefix.ptr->Clear();
		Node::Free(art, node);
		return old_status;
	}

	// There are bytes left before the split.
	// The subsequent node replaces the split byte.
	node = *prefix.ptr;
	return GateStatus::GATE_NOT_SET;
}